

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O1

Ptr __thiscall r_comp::RepliStruct::loadReplicodeFile(RepliStruct *this,string *filename)

{
  undefined8 uVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ptr PVar5;
  uint64_t a;
  uint64_t b;
  string oldFile;
  ifstream loadStream;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  Type local_238;
  undefined4 uStack_234;
  byte abStack_218 [488];
  
  uVar1 = GlobalLine;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,GlobalFilename_abi_cxx11_,DAT_0014c178 + GlobalFilename_abi_cxx11_)
  ;
  GlobalLine = 1;
  std::__cxx11::string::_M_assign((string *)&GlobalFilename_abi_cxx11_);
  local_238 = Root;
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->cmd,(RepliStruct **)this,
             (allocator<r_comp::RepliStruct> *)&local_298,&local_238);
  std::ifstream::ifstream(&local_238,(in_RDX->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(CONCAT44(uStack_234,local_238) + -0x18)] & 7) == 0) {
    local_298 = (long *)0x0;
    local_278._M_dataplus._M_p = (pointer)0x0;
    parse(*(RepliStruct **)this,(istream *)&local_238,(uint64_t *)&local_298,(uint64_t *)&local_278,
          0);
    if ((abStack_218[*(long *)(CONCAT44(uStack_234,local_238) + -0x18)] & 2) == 0) {
      std::__cxx11::string::_M_replace
                (*(long *)this + 0x68,0,*(char **)(*(long *)this + 0x70),0x13f288);
    }
    std::ifstream::close();
    GlobalLine = (long)(int)uVar1;
    std::__cxx11::string::_M_assign((string *)&GlobalFilename_abi_cxx11_);
  }
  else {
    std::operator+(&local_278,"Load: File \'",in_RDX);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_278);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_288 = *plVar3;
      lStack_280 = plVar2[3];
      local_298 = &local_288;
    }
    else {
      local_288 = *plVar3;
      local_298 = (long *)*plVar2;
    }
    local_290 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)(*(long *)this + 0x68),(ulong)local_298);
    if (local_298 != &local_288) {
      operator_delete(local_298);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&local_238);
  _Var4._M_pi = extraout_RDX;
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
    _Var4._M_pi = extraout_RDX_00;
  }
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliStruct::loadReplicodeFile(const std::string &filename)
{
    int oldLine = GlobalLine;
    std::string oldFile = GlobalFilename;
    GlobalLine = 1;
    GlobalFilename = filename;
    RepliStruct::Ptr newRoot = std::make_shared<RepliStruct>(Root);
    std::ifstream loadStream(filename.c_str());

    if (loadStream.bad() || loadStream.fail() || loadStream.eof()) {
        newRoot->error += "Load: File '" + filename + "' cannot be read! ";
        loadStream.close();
        return newRoot;
    }

    // create new Root structure
    uint64_t a = 0, b = 0;

    if (newRoot->parse(&loadStream, a, b) < 0) {
        // error is already recorded in newRoot
    }

    if (!loadStream.eof()) {
        newRoot->error = "Code structure error: Unmatched ) or ].\n";
    }

    loadStream.close();
    GlobalLine = oldLine;
    GlobalFilename = oldFile;
    return newRoot;
}